

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

bool absl::lts_20250127::anon_unknown_1::SafeAddRepHi(double a_hi,double b_hi,Duration *d)

{
  uint32_t in_EDX;
  double dVar1;
  Duration DVar2;
  
  dVar1 = a_hi + b_hi;
  if (9.223372036854776e+18 <= dVar1) {
    (d->rep_hi_).lo_ = 0xffffffff;
    (d->rep_hi_).hi_ = 0x7fffffff;
    d->rep_lo_ = 0xffffffff;
  }
  else {
    if (-9.223372036854776e+18 < dVar1) {
      d->rep_hi_ = (HiRep)(long)dVar1;
      return true;
    }
    DVar2.rep_lo_ = in_EDX;
    DVar2.rep_hi_.lo_ = 0xffffffff;
    DVar2.rep_hi_.hi_ = 0xffffffff;
    DVar2 = operator-((lts_20250127 *)0x7fffffffffffffff,DVar2);
    *d = DVar2;
  }
  return false;
}

Assistant:

inline bool SafeAddRepHi(double a_hi, double b_hi, Duration* d) {
  double c = a_hi + b_hi;
  if (c >= static_cast<double>(kint64max)) {
    *d = InfiniteDuration();
    return false;
  }
  if (c <= static_cast<double>(kint64min)) {
    *d = -InfiniteDuration();
    return false;
  }
  *d = time_internal::MakeDuration(c, time_internal::GetRepLo(*d));
  return true;
}